

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void const_array_suite::expand_front(void)

{
  iterator iVar1;
  iterator iVar2;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_91;
  vector<int,_std::allocator<int>_> expect;
  int local_74 [3];
  circular_view<const_int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.data = array;
  array[0] = 0xb;
  array[1] = 0x16;
  array[2] = 0x21;
  array[3] = 0;
  span.member.cap = 3;
  span.member.size = 3;
  span.member.next = 3;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3;
  local_74[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7d7,"void const_array_suite::expand_front()",&expect,local_74);
  local_74[0] = 0xb;
  local_74[1] = 0x16;
  local_74[2] = 0x21;
  __l._M_len = 3;
  __l._M_array = local_74;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_91);
  iVar1 = vista::circular_view<const_int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<const_int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7db,"void const_array_suite::expand_front()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  vista::circular_view<const_int,_18446744073709551615UL>::expand_front(&span,1);
  local_74[0] = 0x21;
  local_74[1] = 0xb;
  local_74[2] = 0x16;
  __l_00._M_len = 3;
  __l_00._M_array = local_74;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l_00,&local_91);
  iVar1 = vista::circular_view<const_int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<const_int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7e1,"void const_array_suite::expand_front()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void expand_front()
{
    int array[4] = { 11, 22, 33 };
    circular_view<const int> span(&array[0], &array[3],
                                   &array[0], 3);
    BOOST_TEST_EQ(span.capacity(), 3);
    {
        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 33, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}